

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_crt.c
# Opt level: O0

int x509_profile_check_key(mbedtls_x509_crt_profile *profile,mbedtls_pk_context_conflict *pk)

{
  mbedtls_pk_type_t mVar1;
  mbedtls_ecp_group_id mVar2;
  mbedtls_ecp_group_id gid;
  mbedtls_pk_type_t pk_alg;
  mbedtls_pk_context_conflict *pk_local;
  mbedtls_x509_crt_profile *profile_local;
  
  mVar1 = mbedtls_pk_get_type(pk);
  if (((mVar1 == MBEDTLS_PK_ECDSA) || (mVar1 == MBEDTLS_PK_ECKEY)) || (mVar1 == MBEDTLS_PK_ECKEY_DH)
     ) {
    mVar2 = mbedtls_pk_get_group_id(pk);
    if (mVar2 == MBEDTLS_ECP_DP_NONE) {
      profile_local._4_4_ = -1;
    }
    else if ((profile->allowed_curves & 1 << ((char)mVar2 - 1U & 0x1f)) == 0) {
      profile_local._4_4_ = -1;
    }
    else {
      profile_local._4_4_ = 0;
    }
  }
  else {
    profile_local._4_4_ = -1;
  }
  return profile_local._4_4_;
}

Assistant:

static int x509_profile_check_key(const mbedtls_x509_crt_profile *profile,
                                  const mbedtls_pk_context *pk)
{
    const mbedtls_pk_type_t pk_alg = mbedtls_pk_get_type(pk);

#if defined(MBEDTLS_RSA_C)
    if (pk_alg == MBEDTLS_PK_RSA || pk_alg == MBEDTLS_PK_RSASSA_PSS) {
        if (mbedtls_pk_get_bitlen(pk) >= profile->rsa_min_bitlen) {
            return 0;
        }

        return -1;
    }
#endif /* MBEDTLS_RSA_C */

#if defined(MBEDTLS_PK_HAVE_ECC_KEYS)
    if (pk_alg == MBEDTLS_PK_ECDSA ||
        pk_alg == MBEDTLS_PK_ECKEY ||
        pk_alg == MBEDTLS_PK_ECKEY_DH) {
        const mbedtls_ecp_group_id gid = mbedtls_pk_get_group_id(pk);

        if (gid == MBEDTLS_ECP_DP_NONE) {
            return -1;
        }

        if ((profile->allowed_curves & MBEDTLS_X509_ID_FLAG(gid)) != 0) {
            return 0;
        }

        return -1;
    }
#endif /* MBEDTLS_PK_HAVE_ECC_KEYS */

    return -1;
}